

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::MessageGenerator
          (MessageGenerator *this,Descriptor *descriptor,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *vars,int index_in_file_messages,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  Options *this_00;
  FieldGeneratorMap *this_01;
  vector<int,_std::allocator<int>_> *this_02;
  vector<int,_std::allocator<int>_> *this_03;
  unique_ptr<google::protobuf::compiler::cpp::MessageLayoutHelper,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
  *puVar1;
  unique_ptr<google::protobuf::compiler::cpp::ParseFunctionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
  *this_04;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_05;
  pointer *pppFVar2;
  char cVar3;
  FieldDescriptor FVar4;
  Descriptor *pDVar5;
  iterator __position;
  pointer ppFVar6;
  FieldDescriptor *descriptor_00;
  MessageSCCAnalyzer *scc_analyzer_00;
  ParseFunctionGenerator *__ptr_00;
  StringPiece injector_template_suffix;
  StringPiece injector_template_suffix_00;
  StringPiece injector_template_suffix_01;
  StringPiece injector_template_suffix_02;
  StringPiece injector_template_suffix_03;
  StringPiece injector_template_prefix;
  StringPiece injector_template_prefix_00;
  StringPiece injector_template_prefix_01;
  StringPiece injector_template_prefix_02;
  StringPiece injector_template_prefix_03;
  bool bVar7;
  byte bVar8;
  int iVar9;
  MessageLayoutHelper *pMVar10;
  mapped_type *pmVar11;
  _Rb_tree_node_base *p_Var12;
  long lVar13;
  char *pcVar14;
  _Rb_tree_node_base *p_Var15;
  LogMessage *pLVar16;
  ParseFunctionGenerator *this_06;
  Options *options_00;
  FieldDescriptor *pFVar17;
  ulong uVar18;
  char *pcVar19;
  AlphaNum *c;
  pointer *__ptr;
  long lVar20;
  pointer ppFVar21;
  int iVar22;
  pointer __old_p;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  bool bVar24;
  StringPiece annotation_name;
  StringPiece annotation_name_00;
  StringPiece annotation_name_01;
  StringPiece annotation_name_02;
  StringPiece annotation_name_03;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range3;
  string str_index;
  Iterator __end3;
  value_type field;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  accessor_annotations_to_hooks;
  string injector_template;
  char *in_stack_fffffffffffff9c8;
  char *local_5d8;
  char *pcStack_5d0;
  undefined4 local_5c8;
  undefined1 local_5c4;
  undefined1 local_5c3;
  AlphaNum local_5b8;
  AlphaNum local_588;
  AlphaNum local_558;
  undefined1 local_528 [16];
  char local_518 [40];
  undefined4 *local_4f0;
  undefined8 local_4e8;
  undefined4 local_4e0;
  undefined1 local_4dc;
  undefined4 *local_4d0;
  undefined8 local_4c8;
  undefined4 local_4c0;
  undefined1 local_4bc;
  undefined4 *local_4b0;
  undefined8 local_4a8;
  undefined4 local_4a0;
  undefined1 local_49c;
  undefined4 *local_490;
  undefined8 local_488;
  undefined4 local_480;
  undefined1 local_47c;
  char *local_470;
  undefined8 uStack_468;
  char *local_460;
  undefined8 uStack_458;
  char *local_450;
  undefined8 uStack_448;
  char *local_440;
  undefined8 uStack_438;
  char *local_430;
  undefined8 uStack_428;
  string local_420;
  undefined4 *local_400;
  undefined8 local_3f8;
  undefined4 local_3f0;
  undefined1 local_3ec;
  undefined1 local_3eb;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_360;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_320;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_220;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  AlphaNum local_60;
  
  this->descriptor_ = descriptor;
  this->index_in_file_messages_ = index_in_file_messages;
  ClassName_abi_cxx11_(&this->classname_,(cpp *)descriptor,(Descriptor *)vars);
  this_00 = &this->options_;
  Options::Options(this_00,options);
  this_01 = &this->field_generators_;
  FieldGeneratorMap::FieldGeneratorMap(this_01,descriptor,options,scc_analyzer);
  this_02 = &this->has_bit_indices_;
  this_03 = &this->inlined_string_indices_;
  this->num_weak_fields_ = 0;
  puVar1 = &this->message_layout_helper_;
  this_04 = &this->parse_function_generator_;
  (this->optimized_order_).
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->optimized_order_).
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->optimized_order_).
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->max_has_bit_index_ = 0;
  (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->enum_generators_).
  super__Vector_base<const_google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<const_google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<const_google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<const_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<const_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<const_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->message_layout_helper_)._M_t.
  super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageLayoutHelper,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
  .super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_false>._M_head_impl
       = (MessageLayoutHelper *)0x0;
  (this->parse_function_generator_)._M_t.
  super___uniq_ptr_impl<google::protobuf::compiler::cpp::ParseFunctionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
  .super__Head_base<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_false>.
  _M_head_impl = (ParseFunctionGenerator *)0x0;
  this->scc_analyzer_ = scc_analyzer;
  this_05 = &this->variables_;
  options_00 = (Options *)this_04;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&this_05->_M_t,&vars->_M_t);
  if ((puVar1->_M_t).
      super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageLayoutHelper,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
      .super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_false>.
      _M_head_impl == (MessageLayoutHelper *)0x0) {
    pMVar10 = (MessageLayoutHelper *)operator_new(8);
    pMVar10->_vptr_MessageLayoutHelper = (_func_int **)&PTR__MessageLayoutHelper_004de508;
    (puVar1->_M_t).
    super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageLayoutHelper,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
    .super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_false>.
    _M_head_impl = pMVar10;
    options_00 = (Options *)puVar1;
  }
  local_3e0.first._M_dataplus._M_p = (pointer)&local_3e0.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"classname","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_05,&local_3e0.first);
  std::__cxx11::string::_M_assign((string *)pmVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0.first._M_dataplus._M_p != &local_3e0.first.field_2) {
    operator_delete(local_3e0.first._M_dataplus._M_p);
  }
  QualifiedClassName_abi_cxx11_
            (&local_3e0.first,(cpp *)this->descriptor_,(Descriptor *)options,options_00);
  local_528._0_8_ = local_518;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"classtype","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_05,(key_type *)local_528);
  std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_3e0);
  if ((char *)local_528._0_8_ != local_518) {
    operator_delete((void *)local_528._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0.first._M_dataplus._M_p != &local_3e0.first.field_2) {
    operator_delete(local_3e0.first._M_dataplus._M_p);
  }
  local_3e0.first._M_dataplus._M_p = (pointer)&local_3e0.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"full_name","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_05,&local_3e0.first);
  std::__cxx11::string::_M_assign((string *)pmVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0.first._M_dataplus._M_p != &local_3e0.first.field_2) {
    operator_delete(local_3e0.first._M_dataplus._M_p);
  }
  SuperClassName_abi_cxx11_
            (&local_3e0.first,(cpp *)this->descriptor_,(Descriptor *)this_00,options_00);
  local_528._0_8_ = local_518;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"superclass","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_05,(key_type *)local_528);
  std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_3e0);
  if ((char *)local_528._0_8_ != local_518) {
    operator_delete((void *)local_528._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0.first._M_dataplus._M_p != &local_3e0.first.field_2) {
    operator_delete(local_3e0.first._M_dataplus._M_p);
  }
  local_3e0.first._M_dataplus._M_p = (pointer)&local_3e0.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"annotate_serialize","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_05,&local_3e0.first);
  std::__cxx11::string::_M_replace((ulong)pmVar11,0,(char *)pmVar11->_M_string_length,0x3e25d9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0.first._M_dataplus._M_p != &local_3e0.first.field_2) {
    operator_delete(local_3e0.first._M_dataplus._M_p);
  }
  local_3e0.first._M_dataplus._M_p = (pointer)&local_3e0.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"annotate_deserialize","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_05,&local_3e0.first);
  std::__cxx11::string::_M_replace((ulong)pmVar11,0,(char *)pmVar11->_M_string_length,0x3e25d9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0.first._M_dataplus._M_p != &local_3e0.first.field_2) {
    operator_delete(local_3e0.first._M_dataplus._M_p);
  }
  local_3e0.first._M_dataplus._M_p = (pointer)&local_3e0.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"annotate_reflection","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_05,&local_3e0.first);
  std::__cxx11::string::_M_replace((ulong)pmVar11,0,(char *)pmVar11->_M_string_length,0x3e25d9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0.first._M_dataplus._M_p != &local_3e0.first.field_2) {
    operator_delete(local_3e0.first._M_dataplus._M_p);
  }
  local_3e0.first._M_dataplus._M_p = (pointer)&local_3e0.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"annotate_bytesize","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_05,&local_3e0.first);
  std::__cxx11::string::_M_replace((ulong)pmVar11,0,(char *)pmVar11->_M_string_length,0x3e25d9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0.first._M_dataplus._M_p != &local_3e0.first.field_2) {
    operator_delete(local_3e0.first._M_dataplus._M_p);
  }
  local_3e0.first._M_dataplus._M_p = (pointer)&local_3e0.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"annotate_mergefrom","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_05,&local_3e0.first);
  std::__cxx11::string::_M_replace((ulong)pmVar11,0,(char *)pmVar11->_M_string_length,0x3e25d9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0.first._M_dataplus._M_p != &local_3e0.first.field_2) {
    operator_delete(local_3e0.first._M_dataplus._M_p);
  }
  if (((options->field_listener_options).inject_field_listener_events == true) &&
     (*(int *)(*(long *)(*(long *)(descriptor + 0x10) + 0x78) + 0xa0) != 3)) {
    local_3e0.first._M_dataplus._M_p = (pointer)&local_3e0.first.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"  _tracker_.","");
    injector_template_prefix.length_ = local_3e0.first._M_string_length;
    injector_template_prefix.ptr_ = local_3e0.first._M_dataplus._M_p;
    if ((long)local_3e0.first._M_string_length < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (local_3e0.first._M_string_length,"string length exceeds max size");
    }
    local_430 = "OnSerialize(this);\n";
    uStack_428 = 0x13;
    injector_template_suffix.length_ = 0x13;
    injector_template_suffix.ptr_ = "OnSerialize(this);\n";
    annotation_name.length_ = 9;
    annotation_name.ptr_ = "serialize";
    anon_unknown_0::MaySetAnnotationVariable
              (options,annotation_name,injector_template_prefix,injector_template_suffix,this_05);
    injector_template_prefix_00.length_ = local_3e0.first._M_string_length;
    injector_template_prefix_00.ptr_ = local_3e0.first._M_dataplus._M_p;
    if ((long)local_3e0.first._M_string_length < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (local_3e0.first._M_string_length,"string length exceeds max size");
    }
    local_440 = "OnDeserialize(this);\n";
    uStack_438 = 0x15;
    injector_template_suffix_00.length_ = 0x15;
    injector_template_suffix_00.ptr_ = "OnDeserialize(this);\n";
    annotation_name_00.length_ = 0xb;
    annotation_name_00.ptr_ = "deserialize";
    anon_unknown_0::MaySetAnnotationVariable
              (options,annotation_name_00,injector_template_prefix_00,injector_template_suffix_00,
               this_05);
    injector_template_prefix_01.length_ = local_3e0.first._M_string_length;
    injector_template_prefix_01.ptr_ = local_3e0.first._M_dataplus._M_p;
    if ((long)local_3e0.first._M_string_length < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (local_3e0.first._M_string_length,"string length exceeds max size");
    }
    local_450 = "OnGetMetadata();\n";
    uStack_448 = 0x11;
    injector_template_suffix_01.length_ = 0x11;
    injector_template_suffix_01.ptr_ = "OnGetMetadata();\n";
    annotation_name_01.length_ = 10;
    annotation_name_01.ptr_ = "reflection";
    anon_unknown_0::MaySetAnnotationVariable
              (options,annotation_name_01,injector_template_prefix_01,injector_template_suffix_01,
               this_05);
    injector_template_prefix_02.length_ = local_3e0.first._M_string_length;
    injector_template_prefix_02.ptr_ = local_3e0.first._M_dataplus._M_p;
    if ((long)local_3e0.first._M_string_length < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (local_3e0.first._M_string_length,"string length exceeds max size");
    }
    local_460 = "OnByteSize(this);\n";
    uStack_458 = 0x12;
    injector_template_suffix_02.length_ = 0x12;
    injector_template_suffix_02.ptr_ = "OnByteSize(this);\n";
    annotation_name_02.length_ = 8;
    annotation_name_02.ptr_ = "bytesize";
    anon_unknown_0::MaySetAnnotationVariable
              (options,annotation_name_02,injector_template_prefix_02,injector_template_suffix_02,
               this_05);
    injector_template_prefix_03.length_ = local_3e0.first._M_string_length;
    injector_template_prefix_03.ptr_ = local_3e0.first._M_dataplus._M_p;
    if ((long)local_3e0.first._M_string_length < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (local_3e0.first._M_string_length,"string length exceeds max size");
    }
    local_470 = "OnMergeFrom(this, &from);\n";
    uStack_468 = 0x1a;
    in_stack_fffffffffffff9c8 = "OnMergeFrom(this, &from);\n";
    injector_template_suffix_03.length_ = 0x1a;
    injector_template_suffix_03.ptr_ = "OnMergeFrom(this, &from);\n";
    annotation_name_03.length_ = 9;
    annotation_name_03.ptr_ = "mergefrom";
    anon_unknown_0::MaySetAnnotationVariable
              (options,annotation_name_03,injector_template_prefix_03,injector_template_suffix_03,
               this_05);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0.first._M_dataplus._M_p != &local_3e0.first.field_2) {
      operator_delete(local_3e0.first._M_dataplus._M_p);
    }
  }
  pDVar5 = this->descriptor_;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[23],_const_char_(&)[15],_true>
            (&local_3e0,(char (*) [23])"annotate_extension_has",(char (*) [15])"OnHasExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[25],_const_char_(&)[17],_true>
            (&local_3a0,(char (*) [25])"annotate_extension_clear",(char (*) [17])"OnClearExtension")
  ;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[33],_const_char_(&)[16],_true>
            (&local_360,(char (*) [33])"annotate_extension_repeated_size",
             (char (*) [16])"OnExtensionSize");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[23],_const_char_(&)[15],_true>
            (&local_320,(char (*) [23])"annotate_extension_get",(char (*) [15])"OnGetExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[27],_const_char_(&)[19],_true>
            (&local_2e0,(char (*) [27])"annotate_extension_mutable",
             (char (*) [19])"OnMutableExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[23],_const_char_(&)[15],_true>
            (&local_2a0,(char (*) [23])"annotate_extension_set",(char (*) [15])"OnSetExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[27],_const_char_(&)[19],_true>
            (&local_260,(char (*) [27])"annotate_extension_release",
             (char (*) [19])"OnReleaseExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[32],_const_char_(&)[15],_true>
            (&local_220,(char (*) [32])"annotate_repeated_extension_get",
             (char (*) [15])"OnGetExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[36],_const_char_(&)[19],_true>
            (&local_1e0,(char (*) [36])"annotate_repeated_extension_mutable",
             (char (*) [19])"OnMutableExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[32],_const_char_(&)[15],_true>
            (&local_1a0,(char (*) [32])"annotate_repeated_extension_set",
             (char (*) [15])"OnSetExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[32],_const_char_(&)[15],_true>
            (&local_160,(char (*) [32])"annotate_repeated_extension_add",
             (char (*) [15])"OnAddExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[40],_const_char_(&)[22],_true>
            (&local_120,(char (*) [40])"annotate_repeated_extension_add_mutable",
             (char (*) [22])"OnAddMutableExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[33],_const_char_(&)[16],_true>
            (&local_e0,(char (*) [33])"annotate_repeated_extension_list",
             (char (*) [16])"OnListExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[41],_const_char_(&)[23],_true>
            (&local_a0,(char (*) [41])"annotate_repeated_extension_list_mutable",
             (char (*) [23])"OnMutableListExtension");
  c = &local_558;
  __l._M_len = 0xe;
  __l._M_array = &local_3e0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_528,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_588,(allocator_type *)c);
  lVar20 = -0x380;
  paVar23 = &local_a0.second.field_2;
  do {
    if (paVar23 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined1 **)(paVar23->_M_local_buf + -0x10)) {
      operator_delete(*(undefined1 **)(paVar23->_M_local_buf + -0x10));
    }
    if (paVar23->_M_local_buf + -0x20 != *(char **)(paVar23->_M_local_buf + -0x30)) {
      operator_delete(*(char **)(paVar23->_M_local_buf + -0x30));
    }
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(paVar23->_M_local_buf + -0x40);
    lVar20 = lVar20 + 0x40;
  } while (lVar20 != 0);
  p_Var12 = (_Rb_tree_node_base *)local_518._8_8_;
  p_Var15 = (_Rb_tree_node_base *)local_518._8_8_;
  while (p_Var12 != (_Rb_tree_node_base *)(local_528 + 8)) {
    local_518._8_8_ = p_Var15;
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](this_05,(key_type *)(p_Var12 + 1));
    c = (AlphaNum *)0x0;
    std::__cxx11::string::_M_replace((ulong)pmVar11,0,(char *)pmVar11->_M_string_length,0x3e25d9);
    p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
    p_Var15 = (_Rb_tree_node_base *)local_518._8_8_;
  }
  if ((((this->options_).field_listener_options.inject_field_listener_events != false) &&
      (*(int *)(*(long *)(*(long *)(pDVar5 + 0x10) + 0x78) + 0xa0) != 3)) &&
     (p_Var15 != (_Rb_tree_node_base *)(local_528 + 8))) {
    do {
      p_Var12 = p_Var15 + 1;
      local_3e0.first._M_dataplus._M_p = (pointer)&local_3e0.first.field_2;
      local_3e0.first.field_2._M_allocated_capacity = 0x6465746165706572;
      local_3e0.first._M_string_length = 8;
      local_3e0.first.field_2._M_local_buf[8] = '\0';
      bVar7 = false;
      lVar20 = std::__cxx11::string::find((char *)p_Var12,(ulong)local_3e0.first._M_dataplus._M_p,0)
      ;
      bVar24 = false;
      if (lVar20 == -1) {
        local_490 = &local_480;
        local_480 = 0x657a6973;
        local_488 = 4;
        local_47c = 0;
        bVar7 = false;
        lVar13 = std::__cxx11::string::find((char *)p_Var12,(ulong)local_490,0);
        bVar24 = false;
        if (lVar13 == -1) {
          local_400 = &local_3f0;
          local_3ec = 0x72;
          local_3f0 = 0x61656c63;
          local_3f8 = 5;
          local_3eb = 0;
          lVar13 = std::__cxx11::string::find((char *)p_Var12,(ulong)local_400,0);
          bVar24 = lVar13 == -1;
          bVar7 = true;
        }
      }
      if ((bVar7) && (local_400 != &local_3f0)) {
        operator_delete(local_400);
      }
      if ((lVar20 == -1) && (local_490 != &local_480)) {
        operator_delete(local_490);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0.first._M_dataplus._M_p != &local_3e0.first.field_2) {
        operator_delete(local_3e0.first._M_dataplus._M_p);
      }
      if (bVar24) {
        local_3e0.first._M_dataplus._M_p._0_4_ = 0x3fa273;
        local_3e0.first._M_dataplus._M_p._4_4_ = 0;
        local_3e0.first._M_string_length = 0xc;
        local_588.piece_data_ = *(char **)(p_Var15 + 2);
        local_588.piece_size_ = (size_t)p_Var15[2]._M_parent;
        local_558.piece_data_ =
             "(this, id.number(), _proto_TypeTraits::GetPtr(id.number(), _extensions_, id.default_value_ref()));"
        ;
        local_558.piece_size_ = 0x62;
        StrCat_abi_cxx11_((string *)&local_5b8,(protobuf *)&local_3e0,&local_588,&local_558,c);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_05,(key_type *)p_Var12);
LAB_002a1699:
        std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_5b8);
        pcVar14 = local_5b8.digits;
        pcVar19 = local_5b8.piece_data_;
LAB_002a199d:
        if (pcVar19 != pcVar14) {
          operator_delete(pcVar19);
        }
      }
      else {
        local_3e0.first._M_dataplus._M_p = (pointer)&local_3e0.first.field_2;
        local_3e0.first.field_2._M_allocated_capacity = 0x6465746165706572;
        local_3e0.first._M_string_length = 8;
        local_3e0.first.field_2._M_local_buf[8] = '\0';
        bVar7 = false;
        lVar20 = std::__cxx11::string::find
                           ((char *)p_Var12,(ulong)local_3e0.first._M_dataplus._M_p,0);
        if (lVar20 == -1) {
          bVar24 = false;
        }
        else {
          local_4b0 = &local_4a0;
          local_4a0 = 0x7473696c;
          local_4a8 = 4;
          local_49c = 0;
          bVar7 = false;
          lVar13 = std::__cxx11::string::find((char *)p_Var12,(ulong)local_4b0,0);
          bVar24 = false;
          if (lVar13 == -1) {
            local_4d0 = &local_4c0;
            local_4c0 = 0x657a6973;
            local_4c8 = 4;
            local_4bc = 0;
            lVar13 = std::__cxx11::string::find((char *)p_Var12,(ulong)local_4d0,0);
            bVar24 = lVar13 == -1;
            bVar7 = true;
          }
        }
        if ((bVar7) && (local_4d0 != &local_4c0)) {
          operator_delete(local_4d0);
        }
        if ((lVar20 != -1) && (local_4b0 != &local_4a0)) {
          operator_delete(local_4b0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e0.first._M_dataplus._M_p != &local_3e0.first.field_2) {
          operator_delete(local_3e0.first._M_dataplus._M_p);
        }
        if (bVar24) {
          local_5d8 = (char *)&local_5c8;
          local_5c4 = 0x78;
          local_5c8 = 0x65646e69;
          pcStack_5d0 = (char *)0x5;
          local_5c3 = 0;
          paVar23 = &local_3e0.first.field_2;
          local_3e0.first._M_string_length = 3;
          local_3e0.first.field_2._M_allocated_capacity._0_4_ = 0x646461;
          local_3e0.first._M_dataplus._M_p = (pointer)paVar23;
          lVar20 = std::__cxx11::string::find((char *)p_Var12,(ulong)paVar23,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e0.first._M_dataplus._M_p != paVar23) {
            operator_delete(local_3e0.first._M_dataplus._M_p);
          }
          if (lVar20 != -1) {
            std::__cxx11::string::_M_replace((ulong)&local_5d8,0,pcStack_5d0,0x402e56);
          }
          local_3e0.first._M_dataplus._M_p._0_4_ = 0x3fa273;
          local_3e0.first._M_dataplus._M_p._4_4_ = 0;
          local_3e0.first._M_string_length = 0xc;
          local_588.piece_data_ = *(char **)(p_Var15 + 2);
          local_588.piece_size_ = (size_t)p_Var15[2]._M_parent;
          local_558.piece_data_ =
               "(this, id.number(), _proto_TypeTraits::GetPtr(id.number(), _extensions_, ";
          local_558.piece_size_ = 0x49;
          local_5b8.piece_data_ = local_5d8;
          local_5b8.piece_size_ = (size_t)pcStack_5d0;
          local_60.piece_data_ = "));";
          local_60.piece_size_ = 3;
          c = &local_5b8;
          StrCat_abi_cxx11_(&local_420,(protobuf *)&local_3e0,&local_588,&local_558,c,&local_60,
                            (AlphaNum *)in_stack_fffffffffffff9c8);
          pmVar11 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](this_05,(key_type *)p_Var12);
          std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_420);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_420._M_dataplus._M_p != &local_420.field_2) {
            operator_delete(local_420._M_dataplus._M_p);
          }
          pcVar14 = (char *)&local_5c8;
          pcVar19 = local_5d8;
          goto LAB_002a199d;
        }
        local_3e0.first._M_dataplus._M_p = (pointer)&local_3e0.first.field_2;
        local_3e0.first._M_string_length = 4;
        local_3e0.first.field_2._M_allocated_capacity._0_5_ = 0x7473696c;
        lVar20 = std::__cxx11::string::find
                           ((char *)p_Var12,(ulong)local_3e0.first._M_dataplus._M_p,0);
        bVar7 = true;
        if (lVar20 == -1) {
          local_4f0 = &local_4e0;
          local_4e0 = 0x657a6973;
          local_4e8 = 4;
          local_4dc = 0;
          lVar20 = std::__cxx11::string::find((char *)p_Var12,(ulong)local_4f0,0);
          bVar7 = lVar20 != -1;
          if (local_4f0 != &local_4e0) {
            operator_delete(local_4f0);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e0.first._M_dataplus._M_p != &local_3e0.first.field_2) {
          operator_delete(local_3e0.first._M_dataplus._M_p);
        }
        if (bVar7) {
          local_3e0.first._M_dataplus._M_p._0_4_ = 0x3fa273;
          local_3e0.first._M_dataplus._M_p._4_4_ = 0;
          local_3e0.first._M_string_length = 0xc;
          local_588.piece_data_ = *(char **)(p_Var15 + 2);
          local_588.piece_size_ = (size_t)p_Var15[2]._M_parent;
          local_558.piece_data_ =
               "(this, id.number(), _proto_TypeTraits::GetRepeatedPtr(id.number(), _extensions_));";
          local_558.piece_size_ = 0x52;
          StrCat_abi_cxx11_((string *)&local_5b8,(protobuf *)&local_3e0,&local_588,&local_558,c);
          pmVar11 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](this_05,(key_type *)p_Var12);
          goto LAB_002a1699;
        }
      }
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
    } while (p_Var15 != (_Rb_tree_node_base *)(local_528 + 8));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_528);
  SetUnknownFieldsVariable(this->descriptor_,this_00,this_05);
  local_588.piece_size_ = (size_t)this->descriptor_;
  local_3e0.first._M_dataplus._M_p._0_4_ = 0;
  local_588.piece_data_ =
       (char *)CONCAT44(local_588.piece_data_._4_4_,*(undefined4 *)(local_588.piece_size_ + 4));
  local_3e0.first._M_string_length = local_588.piece_size_;
  while (bVar7 = operator==((Iterator *)&local_3e0,(Iterator *)&local_588), !bVar7) {
    local_558.piece_data_ =
         (char *)(*(long *)(local_3e0.first._M_string_length + 0x28) +
                 (long)(int)local_3e0.first._M_dataplus._M_p * 0x48);
    cVar3 = *(char *)(*(long *)((FieldDescriptor *)local_558.piece_data_ + 0x38) + 0x4f);
    if (cVar3 == '\0') {
LAB_002a1c0e:
      lVar20 = *(long *)(local_558.piece_data_ + 0x28);
      if ((lVar20 == 0 || ((byte)*(FieldDescriptor *)(local_558.piece_data_ + 1) & 0x10) == 0) ||
         ((*(int *)(lVar20 + 4) == 1 &&
          ((byte)(lVar20 == 0 | (*(byte *)(*(long *)(lVar20 + 0x20) + 1) & 2) >> 1) == 1)))) {
        __position._M_current =
             (this->optimized_order_).
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
          ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                    ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                      *)&this->optimized_order_,__position,(FieldDescriptor **)&local_558);
        }
        else {
          *__position._M_current = (FieldDescriptor *)local_558.piece_data_;
          pppFVar2 = &(this->optimized_order_).
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppFVar2 = *pppFVar2 + 1;
        }
      }
    }
    else {
      if ((this->options_).opensource_runtime == true) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_528,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.h"
                   ,0x138);
        pLVar16 = internal::LogMessage::operator<<
                            ((LogMessage *)local_528,"CHECK failed: !options.opensource_runtime: ");
        internal::LogFinisher::operator=((LogFinisher *)&local_5b8,pLVar16);
        internal::LogMessage::~LogMessage((LogMessage *)local_528);
      }
      if (cVar3 == '\0') goto LAB_002a1c0e;
      this->num_weak_fields_ = this->num_weak_fields_ + 1;
    }
    local_3e0.first._M_dataplus._M_p._0_4_ = (int)local_3e0.first._M_dataplus._M_p + 1;
  }
  pMVar10 = (this->message_layout_helper_)._M_t.
            super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageLayoutHelper,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
            .super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_false>.
            _M_head_impl;
  (*pMVar10->_vptr_MessageLayoutHelper[2])
            (pMVar10,&this->optimized_order_,this_00,this->scc_analyzer_);
  ppFVar6 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar21 = (this->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppFVar21 != ppFVar6;
      ppFVar21 = ppFVar21 + 1) {
    descriptor_00 = *ppFVar21;
    FVar4 = descriptor_00[1];
    if (((byte)FVar4 & 2) == 0) {
      if ((((byte)FVar4 & 0x60) == 0x20) &&
         (*(char *)(*(long *)(descriptor_00 + 0x10) + 0x3a) == '\x02')) {
        if ((((byte)FVar4 & 0x10) == 0) || (*(long *)(descriptor_00 + 0x28) == 0))
        goto LAB_002a1d01;
      }
      else if (((byte)FVar4 & 0x60) == 0x40) goto LAB_002a1d01;
    }
    else {
LAB_002a1d01:
      if (*(char *)(*(long *)(descriptor_00 + 0x38) + 0x4f) == '\0') {
        if ((this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<int,_std::allocator<int>_>::resize
                    (this_02,(long)*(int *)(this->descriptor_ + 4),&(anonymous_namespace)::kNoHasbit
                    );
        }
        iVar22 = this->max_has_bit_index_;
        this->max_has_bit_index_ = iVar22 + 1;
        if (((byte)descriptor_00[1] & 8) == 0) {
          pFVar17 = descriptor_00 + 0x20;
          uVar18 = 0x28;
        }
        else {
          pFVar17 = descriptor_00 + 0x28;
          if (*(long *)(descriptor_00 + 0x28) == 0) {
            pFVar17 = descriptor_00 + 0x10;
          }
          uVar18 = (ulong)(*(long *)(descriptor_00 + 0x28) == 0) << 5 | 0x50;
        }
        (this_02->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[(int)((ulong)((long)descriptor_00 - *(long *)(*(long *)pFVar17 + uVar18)) >> 3) *
                 0x38e38e39] = iVar22;
      }
    }
    bVar7 = IsStringInlined(descriptor_00,this_00);
    if (bVar7) {
      if ((this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<int,_std::allocator<int>_>::resize
                  (this_03,(long)*(int *)(this->descriptor_ + 4),&(anonymous_namespace)::kNoHasbit);
      }
      iVar22 = this->max_inlined_string_index_;
      this->max_inlined_string_index_ = iVar22 + 1;
      if (((byte)descriptor_00[1] & 8) == 0) {
        pFVar17 = descriptor_00 + 0x20;
        uVar18 = 0x28;
      }
      else {
        pFVar17 = descriptor_00 + 0x28;
        if (*(long *)(descriptor_00 + 0x28) == 0) {
          pFVar17 = descriptor_00 + 0x10;
        }
        uVar18 = (ulong)(*(long *)(descriptor_00 + 0x28) == 0) << 5 | 0x50;
      }
      (this_03->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[(int)((ulong)((long)descriptor_00 - *(long *)(*(long *)pFVar17 + uVar18)) >> 3) *
               0x38e38e39] = iVar22;
    }
  }
  if ((this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    FieldGeneratorMap::SetHasBitIndices(this_01,this_02);
  }
  if ((this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    FieldGeneratorMap::SetInlinedStringIndices(this_01,this_03);
  }
  this->num_required_fields_ = 0;
  iVar22 = *(int *)(descriptor + 4);
  if (0 < (long)iVar22) {
    iVar9 = this->num_required_fields_;
    lVar20 = *(long *)(descriptor + 0x28);
    lVar13 = 0;
    do {
      if ((*(byte *)(lVar20 + 1 + lVar13) & 0x60) == 0x40) {
        iVar9 = iVar9 + 1;
        this->num_required_fields_ = iVar9;
      }
      lVar13 = lVar13 + 0x48;
    } while ((long)iVar22 * 0x48 != lVar13);
  }
  if ((this->options_).table_driven_parsing == true) {
    pDVar5 = this->descriptor_;
    iVar22 = *(int *)(pDVar5 + 4);
    if (0 < (long)iVar22) {
      scc_analyzer_00 = this->scc_analyzer_;
      lVar20 = *(long *)(pDVar5 + 0x28);
      lVar13 = 0;
      do {
        bVar8 = *(byte *)(lVar20 + 1 + lVar13);
        if ((bVar8 & 2) == 0) {
          if (((bVar8 & 0x60) == 0x20) &&
             (*(char *)(*(long *)(lVar20 + 0x10 + lVar13) + 0x3a) == '\x02')) {
            if (((bVar8 & 0x10) == 0) || (*(long *)(lVar20 + 0x28 + lVar13) == 0))
            goto LAB_002a1f2a;
          }
          else if ((bVar8 & 0x60) == 0x40) goto LAB_002a1f2a;
        }
        else {
LAB_002a1f2a:
          if (*(char *)(*(long *)(lVar20 + 0x38 + lVar13) + 0x4f) != '\x01') {
            local_588.piece_data_ = (char *)((ulong)local_588.piece_data_ & 0xffffffff00000000);
            local_558.piece_data_ = (char *)CONCAT44(local_558.piece_data_._4_4_,iVar22);
            local_588.piece_size_ = (size_t)pDVar5;
            local_558.piece_size_ = (size_t)pDVar5;
            bVar7 = operator==((Iterator *)&local_588,(Iterator *)&local_558);
            iVar22 = 0;
            if (bVar7) goto LAB_002a20b5;
            iVar22 = 0;
            goto LAB_002a1fea;
          }
        }
        lVar13 = lVar13 + 0x48;
      } while ((long)iVar22 * 0x48 != lVar13);
    }
  }
  goto LAB_002a1f3e;
  while( true ) {
    bVar24 = IsLazy((FieldDescriptor *)(lVar20 + lVar13 * 0x48),this_00,scc_analyzer_00);
    if (bVar24) break;
    local_588.piece_data_ =
         (char *)CONCAT44(local_588.piece_data_._4_4_,(int)local_588.piece_data_ + 1);
    bVar7 = operator==((Iterator *)&local_588,(Iterator *)&local_558);
    if (bVar7) break;
LAB_002a1fea:
    lVar13 = (long)(int)local_588.piece_data_;
    lVar20 = *(long *)(local_588.piece_size_ + 0x28);
    iVar9 = *(int *)(lVar20 + 4 + lVar13 * 0x48);
    if (iVar9 < iVar22) {
      iVar9 = iVar22;
    }
    iVar22 = iVar9;
    if (*(char *)(*(long *)(lVar20 + 0x38 + lVar13 * 0x48) + 0x4f) == '\x01') {
      if ((this->options_).opensource_runtime == true) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&local_3e0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.h"
                   ,0x138);
        pLVar16 = internal::LogMessage::operator<<
                            ((LogMessage *)&local_3e0,"CHECK failed: !options.opensource_runtime: ")
        ;
        internal::LogFinisher::operator=((LogFinisher *)&local_5b8,pLVar16);
        internal::LogMessage::~LogMessage((LogMessage *)&local_3e0);
      }
      break;
    }
  }
LAB_002a20b5:
  bVar8 = false;
  if ((bVar7 == false) || (0x7fff < iVar22)) goto LAB_002a1f40;
  if ((double)iVar22 * 0.5 <= (double)*(int *)(pDVar5 + 4)) {
    bVar8 = *(byte *)(*(long *)(pDVar5 + 0x20) + 0x4b) ^ 1;
    goto LAB_002a1f40;
  }
LAB_002a1f3e:
  bVar8 = false;
LAB_002a1f40:
  this->table_driven_ = (bool)bVar8;
  this_06 = (ParseFunctionGenerator *)operator_new(0x70);
  ParseFunctionGenerator::ParseFunctionGenerator
            (this_06,this->descriptor_,this->max_has_bit_index_,this_02,this_03,this_00,
             this->scc_analyzer_,this_05);
  __ptr_00 = (this_04->_M_t).
             super___uniq_ptr_impl<google::protobuf::compiler::cpp::ParseFunctionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
             .
             super__Head_base<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_false>
             ._M_head_impl;
  (this_04->_M_t).
  super___uniq_ptr_impl<google::protobuf::compiler::cpp::ParseFunctionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
  .super__Head_base<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_false>.
  _M_head_impl = this_06;
  if (__ptr_00 != (ParseFunctionGenerator *)0x0) {
    std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>::operator()
              ((default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator> *)this_04,
               __ptr_00);
  }
  return;
}

Assistant:

MessageGenerator::MessageGenerator(
    const Descriptor* descriptor,
    const std::map<std::string, std::string>& vars, int index_in_file_messages,
    const Options& options, MessageSCCAnalyzer* scc_analyzer)
    : descriptor_(descriptor),
      index_in_file_messages_(index_in_file_messages),
      classname_(ClassName(descriptor, false)),
      options_(options),
      field_generators_(descriptor, options, scc_analyzer),
      max_has_bit_index_(0),
      max_inlined_string_index_(0),
      num_weak_fields_(0),
      scc_analyzer_(scc_analyzer),
      variables_(vars) {
  if (!message_layout_helper_) {
    message_layout_helper_.reset(new PaddingOptimizer());
  }

  // Variables that apply to this class
  variables_["classname"] = classname_;
  variables_["classtype"] = QualifiedClassName(descriptor_, options);
  variables_["full_name"] = descriptor_->full_name();
  variables_["superclass"] = SuperClassName(descriptor_, options_);
  variables_["annotate_serialize"] = "";
  variables_["annotate_deserialize"] = "";
  variables_["annotate_reflection"] = "";
  variables_["annotate_bytesize"] = "";
  variables_["annotate_mergefrom"] = "";

  if (options.field_listener_options.inject_field_listener_events &&
      descriptor->file()->options().optimize_for() !=
          google::protobuf::FileOptions::LITE_RUNTIME) {
    const std::string injector_template = "  _tracker_.";

    MaySetAnnotationVariable(options, "serialize", injector_template,
                             "OnSerialize(this);\n", &variables_);
    MaySetAnnotationVariable(options, "deserialize", injector_template,
                             "OnDeserialize(this);\n", &variables_);
    // TODO(danilak): Ideally annotate_reflection should not exist and we need
    // to annotate all reflective calls on our own, however, as this is a cause
    // for side effects, i.e. reading values dynamically, we want the users know
    // that dynamic access can happen.
    MaySetAnnotationVariable(options, "reflection", injector_template,
                             "OnGetMetadata();\n", &variables_);
    MaySetAnnotationVariable(options, "bytesize", injector_template,
                             "OnByteSize(this);\n", &variables_);
    MaySetAnnotationVariable(options, "mergefrom", injector_template,
                             "OnMergeFrom(this, &from);\n", &variables_);
  }

  GenerateExtensionAnnotations(descriptor_, options_, &variables_);

  SetUnknownFieldsVariable(descriptor_, options_, &variables_);

  // Compute optimized field order to be used for layout and initialization
  // purposes.
  for (auto field : FieldRange(descriptor_)) {
    if (IsFieldStripped(field, options_)) {
      continue;
    }

    if (IsWeak(field, options_)) {
      num_weak_fields_++;
    } else if (!field->real_containing_oneof()) {
      optimized_order_.push_back(field);
    }
  }

  message_layout_helper_->OptimizeLayout(&optimized_order_, options_,
                                         scc_analyzer_);

  // This message has hasbits iff one or more fields need one.
  for (auto field : optimized_order_) {
    if (HasHasbit(field)) {
      if (has_bit_indices_.empty()) {
        has_bit_indices_.resize(descriptor_->field_count(), kNoHasbit);
      }
      has_bit_indices_[field->index()] = max_has_bit_index_++;
    }
    if (IsStringInlined(field, options_)) {
      if (inlined_string_indices_.empty()) {
        inlined_string_indices_.resize(descriptor_->field_count(), kNoHasbit);
      }
      inlined_string_indices_[field->index()] = max_inlined_string_index_++;
    }
  }

  if (!has_bit_indices_.empty()) {
    field_generators_.SetHasBitIndices(has_bit_indices_);
  }

  if (!inlined_string_indices_.empty()) {
    field_generators_.SetInlinedStringIndices(inlined_string_indices_);
  }

  num_required_fields_ = 0;
  for (int i = 0; i < descriptor->field_count(); i++) {
    if (descriptor->field(i)->is_required()) {
      ++num_required_fields_;
    }
  }

  table_driven_ =
      TableDrivenParsingEnabled(descriptor_, options_, scc_analyzer_);
  parse_function_generator_.reset(new ParseFunctionGenerator(
      descriptor_, max_has_bit_index_, has_bit_indices_,
      inlined_string_indices_, options_, scc_analyzer_, variables_));
}